

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_comparator.cc
# Opt level: O1

ComparisonResult __thiscall
google::protobuf::util::DefaultFieldComparator::Compare
          (DefaultFieldComparator *this,Message *message_1,Message *message_2,FieldDescriptor *field
          ,int index_1,int index_2,FieldContext *field_context)

{
  size_t __n;
  bool bVar1;
  byte bVar2;
  uint32 uVar3;
  uint32 uVar4;
  int iVar5;
  uint64 uVar6;
  uint64 uVar7;
  EnumValueDescriptor *pEVar8;
  EnumValueDescriptor *pEVar9;
  LogMessage *pLVar10;
  string *psVar11;
  string *psVar12;
  Reflection *this_00;
  Reflection *this_01;
  ComparisonResult CVar13;
  bool bVar14;
  undefined4 uVar15;
  float value_1;
  float value_2;
  double value_1_00;
  double dVar16;
  undefined4 uVar17;
  FieldDescriptor *local_b0;
  undefined1 local_a8 [8];
  string scratch1;
  undefined1 local_70 [8];
  string scratch2;
  
  scratch2.field_2._8_8_ = this;
  (*(message_1->super_MessageLite)._vptr_MessageLite[0x13])(message_1);
  (*(message_2->super_MessageLite)._vptr_MessageLite[0x13])(message_2);
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_a8 = (undefined1  [8])FieldDescriptor::TypeOnceInit;
    local_70 = (undefined1  [8])field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_a8,
               (FieldDescriptor **)local_70);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4)) {
  case 1:
    if (*(int *)(field + 0x3c) == 3) {
      uVar3 = Reflection::GetRepeatedInt32(this_00,message_1,field,index_1);
      uVar4 = Reflection::GetRepeatedInt32(this_01,message_2,field,index_2);
    }
    else {
      uVar3 = Reflection::GetInt32(this_00,message_1,field);
      uVar4 = Reflection::GetInt32(this_01,message_2,field);
    }
    goto LAB_003099b8;
  case 2:
    if (*(int *)(field + 0x3c) == 3) {
      uVar6 = Reflection::GetRepeatedInt64(this_00,message_1,field,index_1);
      uVar7 = Reflection::GetRepeatedInt64(this_01,message_2,field,index_2);
    }
    else {
      uVar6 = Reflection::GetInt64(this_00,message_1,field);
      uVar7 = Reflection::GetInt64(this_01,message_2,field);
    }
    goto LAB_003099df;
  case 3:
    if (*(int *)(field + 0x3c) == 3) {
      uVar3 = Reflection::GetRepeatedUInt32(this_00,message_1,field,index_1);
      uVar4 = Reflection::GetRepeatedUInt32(this_01,message_2,field,index_2);
    }
    else {
      uVar3 = Reflection::GetUInt32(this_00,message_1,field);
      uVar4 = Reflection::GetUInt32(this_01,message_2,field);
    }
LAB_003099b8:
    bVar14 = uVar3 == uVar4;
LAB_003099e4:
    CVar13 = (ComparisonResult)!bVar14;
    break;
  case 4:
    if (*(int *)(field + 0x3c) == 3) {
      uVar6 = Reflection::GetRepeatedUInt64(this_00,message_1,field,index_1);
      uVar7 = Reflection::GetRepeatedUInt64(this_01,message_2,field,index_2);
    }
    else {
      uVar6 = Reflection::GetUInt64(this_00,message_1,field);
      uVar7 = Reflection::GetUInt64(this_01,message_2,field);
    }
LAB_003099df:
    bVar14 = uVar6 == uVar7;
    goto LAB_003099e4;
  case 5:
    if (*(int *)(field + 0x3c) == 3) {
      value_1_00 = Reflection::GetRepeatedDouble(this_00,message_1,field,index_1);
      dVar16 = Reflection::GetRepeatedDouble(this_01,message_2,field,index_2);
      uVar15 = SUB84(dVar16,0);
      uVar17 = (undefined4)((ulong)dVar16 >> 0x20);
    }
    else {
      value_1_00 = Reflection::GetDouble(this_00,message_1,field);
      dVar16 = Reflection::GetDouble(this_01,message_2,field);
      uVar15 = SUB84(dVar16,0);
      uVar17 = (undefined4)((ulong)dVar16 >> 0x20);
    }
    bVar14 = CompareDoubleOrFloat<double>
                       ((DefaultFieldComparator *)scratch2.field_2._8_8_,field,value_1_00,
                        (double)CONCAT44(uVar17,uVar15));
    goto LAB_00309a1f;
  case 6:
    if (*(int *)(field + 0x3c) == 3) {
      value_1 = Reflection::GetRepeatedFloat(this_00,message_1,field,index_1);
      value_2 = Reflection::GetRepeatedFloat(this_01,message_2,field,index_2);
    }
    else {
      value_1 = Reflection::GetFloat(this_00,message_1,field);
      value_2 = Reflection::GetFloat(this_01,message_2,field);
    }
    bVar14 = CompareDoubleOrFloat<float>
                       ((DefaultFieldComparator *)scratch2.field_2._8_8_,field,value_1,value_2);
LAB_00309a1f:
    bVar2 = bVar14 ^ 1;
LAB_00309a46:
    CVar13 = (ComparisonResult)bVar2;
    break;
  case 7:
    if (*(int *)(field + 0x3c) == 3) {
      bVar14 = Reflection::GetRepeatedBool(this_00,message_1,field,index_1);
      bVar1 = Reflection::GetRepeatedBool(this_01,message_2,field,index_2);
    }
    else {
      bVar14 = Reflection::GetBool(this_00,message_1,field);
      bVar1 = Reflection::GetBool(this_01,message_2,field);
    }
    bVar2 = bVar1 ^ bVar14;
    goto LAB_00309a46;
  case 8:
    if (*(int *)(field + 0x3c) == 3) {
      pEVar8 = Reflection::GetRepeatedEnum(this_00,message_1,field,index_1);
      pEVar9 = Reflection::GetRepeatedEnum(this_01,message_2,field,index_2);
    }
    else {
      pEVar8 = Reflection::GetEnum(this_00,message_1,field);
      pEVar9 = Reflection::GetEnum(this_01,message_2,field);
    }
    bVar14 = *(int *)(pEVar8 + 0x10) == *(int *)(pEVar9 + 0x10);
    goto LAB_003099e4;
  case 9:
    if (*(int *)(field + 0x3c) == 3) {
      local_a8 = (undefined1  [8])&scratch1._M_string_length;
      scratch1._M_dataplus._M_p = (pointer)0x0;
      scratch1._M_string_length._0_1_ = 0;
      local_70 = (undefined1  [8])&scratch2._M_string_length;
      scratch2._M_dataplus._M_p = (pointer)0x0;
      scratch2._M_string_length._0_1_ = 0;
      psVar11 = Reflection::GetRepeatedStringReference
                          (this_00,message_1,field,index_1,(string *)local_a8);
      psVar12 = Reflection::GetRepeatedStringReference
                          (this_01,message_2,field,index_2,(string *)local_70);
    }
    else {
      local_a8 = (undefined1  [8])&scratch1._M_string_length;
      scratch1._M_dataplus._M_p = (pointer)0x0;
      scratch1._M_string_length._0_1_ = 0;
      local_70 = (undefined1  [8])&scratch2._M_string_length;
      scratch2._M_dataplus._M_p = (pointer)0x0;
      scratch2._M_string_length._0_1_ = 0;
      psVar11 = Reflection::GetStringReference(this_00,message_1,field,(string *)local_a8);
      psVar12 = Reflection::GetStringReference(this_01,message_2,field,(string *)local_70);
    }
    __n = psVar11->_M_string_length;
    CVar13 = DIFFERENT;
    if (__n == psVar12->_M_string_length) {
      if (__n == 0) {
        CVar13 = SAME;
      }
      else {
        iVar5 = bcmp((psVar11->_M_dataplus)._M_p,(psVar12->_M_dataplus)._M_p,__n);
        CVar13 = (ComparisonResult)(iVar5 != 0);
      }
    }
    if (local_70 != (undefined1  [8])&scratch2._M_string_length) {
      operator_delete((void *)local_70);
    }
    if (local_a8 != (undefined1  [8])&scratch1._M_string_length) {
      operator_delete((void *)local_a8);
    }
    break;
  case 10:
    CVar13 = RECURSE;
    break;
  default:
    protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/util/field_comparator.cc"
               ,0x7c);
    pLVar10 = protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_a8,"No comparison code for field ");
    pLVar10 = protobuf::internal::LogMessage::operator<<(pLVar10,*(string **)(field + 8));
    pLVar10 = protobuf::internal::LogMessage::operator<<(pLVar10," of CppType = ");
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_70 = (undefined1  [8])FieldDescriptor::TypeOnceInit;
      local_b0 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_70,&local_b0
                );
    }
    pLVar10 = protobuf::internal::LogMessage::operator<<
                        (pLVar10,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                         (ulong)*(uint *)(field + 0x38) * 4));
    protobuf::internal::LogFinisher::operator=((LogFinisher *)local_70,pLVar10);
    protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_a8);
    CVar13 = DIFFERENT;
  }
  return CVar13;
}

Assistant:

FieldComparator::ComparisonResult DefaultFieldComparator::Compare(
    const Message& message_1, const Message& message_2,
    const FieldDescriptor* field, int index_1, int index_2,
    const util::FieldContext* field_context) {
  const Reflection* reflection_1 = message_1.GetReflection();
  const Reflection* reflection_2 = message_2.GetReflection();

  switch (field->cpp_type()) {
#define COMPARE_FIELD(METHOD)                                                 \
  if (field->is_repeated()) {                                                 \
    return ResultFromBoolean(Compare##METHOD(                                 \
        *field, reflection_1->GetRepeated##METHOD(message_1, field, index_1), \
        reflection_2->GetRepeated##METHOD(message_2, field, index_2)));       \
  } else {                                                                    \
    return ResultFromBoolean(                                                 \
        Compare##METHOD(*field, reflection_1->Get##METHOD(message_1, field),  \
                        reflection_2->Get##METHOD(message_2, field)));        \
  }                                                                           \
  break;  // Make sure no fall-through is introduced.

    case FieldDescriptor::CPPTYPE_BOOL:
      COMPARE_FIELD(Bool);
    case FieldDescriptor::CPPTYPE_DOUBLE:
      COMPARE_FIELD(Double);
    case FieldDescriptor::CPPTYPE_ENUM:
      COMPARE_FIELD(Enum);
    case FieldDescriptor::CPPTYPE_FLOAT:
      COMPARE_FIELD(Float);
    case FieldDescriptor::CPPTYPE_INT32:
      COMPARE_FIELD(Int32);
    case FieldDescriptor::CPPTYPE_INT64:
      COMPARE_FIELD(Int64);
    case FieldDescriptor::CPPTYPE_STRING:
      if (field->is_repeated()) {
        // Allocate scratch strings to store the result if a conversion is
        // needed.
        std::string scratch1;
        std::string scratch2;
        return ResultFromBoolean(
            CompareString(*field,
                          reflection_1->GetRepeatedStringReference(
                              message_1, field, index_1, &scratch1),
                          reflection_2->GetRepeatedStringReference(
                              message_2, field, index_2, &scratch2)));
      } else {
        // Allocate scratch strings to store the result if a conversion is
        // needed.
        std::string scratch1;
        std::string scratch2;
        return ResultFromBoolean(CompareString(
            *field,
            reflection_1->GetStringReference(message_1, field, &scratch1),
            reflection_2->GetStringReference(message_2, field, &scratch2)));
      }
      break;
    case FieldDescriptor::CPPTYPE_UINT32:
      COMPARE_FIELD(UInt32);
    case FieldDescriptor::CPPTYPE_UINT64:
      COMPARE_FIELD(UInt64);

#undef COMPARE_FIELD

    case FieldDescriptor::CPPTYPE_MESSAGE:
      return RECURSE;

    default:
      GOOGLE_LOG(FATAL) << "No comparison code for field " << field->full_name()
                 << " of CppType = " << field->cpp_type();
      return DIFFERENT;
  }
}